

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexjson.h
# Opt level: O3

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_0000003c;
  json_reader jStack_38;
  
  json_deserializer::json_reader::json_reader(&jStack_38,(string *)__buf);
  json_deserializer::deserialize
            ((json_object *)CONCAT44(in_register_0000003c,__fd),(json_deserializer *)&jStack_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)jStack_38.cbuf._M_dataplus._M_p != &jStack_38.cbuf.field_2) {
    operator_delete(jStack_38.cbuf._M_dataplus._M_p,jStack_38.cbuf.field_2._M_allocated_capacity + 1
                   );
  }
  return (ssize_t)(json_object *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

json_object read(string value) {
    return json_deserializer(value).deserialize();
}